

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O3

void cli::anon_unknown_1::addDirectory(ArchiveBuilder *archive,string *path,bool recursive)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  DIR *__dirp;
  dirent *pdVar3;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000011;
  __string_type __str;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  string local_58;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,recursive);
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      paVar1 = &local_58.field_2;
      do {
        if ((pdVar3->d_name[0] != '.') ||
           ((pdVar3->d_name[1] != '\0' &&
            ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0')))))) {
          if (pdVar3->d_type == '\x04') {
            if ((char)local_34 == '\0') goto LAB_0010eeac;
            local_78 = local_68;
            pcVar2 = (path->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar2,pcVar2 + path->_M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_58.field_2._M_allocated_capacity = *psVar5;
              local_58.field_2._8_8_ = plVar4[3];
              local_58._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar5;
              local_58._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_58._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            addDirectory(archive,&local_58,true);
          }
          else {
            local_78 = local_68;
            pcVar2 = (path->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar2,pcVar2 + path->_M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_58.field_2._M_allocated_capacity = *psVar5;
              local_58.field_2._8_8_ = plVar4[3];
              local_58._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar5;
              local_58._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_58._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ZAP::ArchiveBuilder::addFile(archive,&local_58,&local_58);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
        }
LAB_0010eeac:
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void addDirectory(ZAP::ArchiveBuilder &archive, const std::string &path, bool recursive)
		{
		#ifdef _WIN32
			HANDLE dir;
			WIN32_FIND_DATAA ent;

			if ((dir = FindFirstFileA((path + "/*").c_str(), &ent)) != INVALID_HANDLE_VALUE)
			{
				do
				{
					if ((std::strcmp(ent.cFileName, ".") == 0) || (std::strcmp(ent.cFileName, "..") == 0))
						continue;

					if (ent.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent.cFileName, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent.cFileName);
					}
				} while (FindNextFileA(dir, &ent));

				FindClose(dir);
			}
		#else
			DIR *dir;
			struct dirent *ent;

			if ((dir = opendir(path.c_str())) != nullptr)
			{
				while ((ent = readdir(dir)) != nullptr)
				{
					if ((std::strcmp(ent->d_name, ".") == 0) || (std::strcmp(ent->d_name, "..") == 0))
						continue;

					if (ent->d_type == DT_DIR)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent->d_name, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent->d_name);
					}
				}

				closedir(dir);
			}
		#endif
		}